

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bimap.hpp
# Opt level: O2

void __thiscall
pstore::broker::
bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
::eraser<int>(bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
              *this,int *r2)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
               ::find(&(this->right_)._M_t,r2);
  if ((_Rb_tree_header *)__position._M_node != &(this->right_)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)this,(key_type *)__position._M_node[1]._M_parent);
    std::
    _Rb_tree<int,std::pair<int_const,std::__cxx11::string_const*>,std::_Select1st<std::pair<int_const,std::__cxx11::string_const*>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::__cxx11::string_const*>,std::_Select1st<std::pair<int_const,std::__cxx11::string_const*>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
                        *)&this->right_,__position);
    return;
  }
  return;
}

Assistant:

void bimap<L, R, Lcmp, Rcmp>::eraser (R2 const & r2) {
            auto it = right_.find (r2);
            if (it != std::end (right_)) {
                auto & a = *it->second;
                left_.erase (a);
                right_.erase (it);
            }
        }